

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qradiobutton.cpp
# Opt level: O3

void __thiscall QRadioButton::mouseMoveEvent(QRadioButton *this,QMouseEvent *e)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  byte bVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QAbstractButton).super_QWidget.field_0x8;
  bVar3 = QWidget::testAttribute_helper((QWidget *)this,WA_Hover);
  if (bVar3) {
    bVar4 = 0;
    if ((((this->super_QAbstractButton).super_QWidget.data)->widget_attributes & 2) != 0) {
      QEventPoint::position();
      bVar4 = (**(code **)(*(long *)&(this->super_QAbstractButton).super_QWidget + 0x1a0))(this);
    }
    if (bVar4 != (*(byte *)(lVar2 + 0x2b4) & 1)) {
      QWidget::update((QWidget *)this);
      *(byte *)(lVar2 + 0x2b4) = *(byte *)(lVar2 + 0x2b4) & 0xfe | bVar4;
    }
  }
  QAbstractButton::mouseMoveEvent(&this->super_QAbstractButton,e);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRadioButton::mouseMoveEvent(QMouseEvent *e)
{
    Q_D(QRadioButton);
    if (testAttribute(Qt::WA_Hover)) {
        bool hit = false;
        if (underMouse())
            hit = hitButton(e->position().toPoint());

        if (hit != d->hovering) {
            update();
            d->hovering = hit;
        }
    }

    QAbstractButton::mouseMoveEvent(e);
}